

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

Node * __thiscall DepsLog::GetFirstReverseDepsNode(DepsLog *this,Node *node)

{
  Node **ppNVar1;
  pointer ppDVar2;
  Deps *pDVar3;
  size_t id;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  ppDVar2 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  do {
    if (lVar4 == (long)(this->deps_).
                       super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)ppDVar2 >> 3) {
      return (Node *)0x0;
    }
    pDVar3 = ppDVar2[lVar4];
    if (pDVar3 != (Deps *)0x0) {
      uVar5 = (ulong)(uint)pDVar3->node_count;
      if (pDVar3->node_count < 1) {
        uVar5 = 0;
      }
      uVar6 = 0;
      while (uVar5 != uVar6) {
        ppNVar1 = pDVar3->nodes + uVar6;
        uVar6 = uVar6 + 1;
        if (*ppNVar1 == node) {
          return (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

Node* DepsLog::GetFirstReverseDepsNode(Node* node) {
  for (size_t id = 0; id < deps_.size(); ++id) {
    Deps* deps = deps_[id];
    if (!deps)
      continue;
    for (int i = 0; i < deps->node_count; ++i) {
      if (deps->nodes[i] == node)
        return nodes_[id];
    }
  }
  return NULL;
}